

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<4,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()
          (static_for<4,_uWS::WebSocketHandshake::Sha1Loop<1>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  static_for<3,_uWS::WebSocketHandshake::Sha1Loop<1>_> local_11;
  
  static_for<3,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()(&local_11,a,b);
  uVar1 = a[1];
  a[3] = a[3] + ((*a ^ a[4]) & uVar1 ^ a[4]) + b[3] + (a[2] << 5 | a[2] >> 0x1b) + 0x5a827999;
  a[1] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }